

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O0

double SRCTools::SincResampler::KaizerWindow::bessel(double x)

{
  double f2;
  double dStack_20;
  uint i;
  double f;
  double sum;
  double x_local;
  
  f = 0.0;
  dStack_20 = 1.0;
  f2._4_4_ = 1;
  while( true ) {
    dStack_20 = ((x * 0.5) / (double)f2._4_4_) * dStack_20;
    if (dStack_20 * dStack_20 <= f * 1.11e-16) break;
    f = dStack_20 * dStack_20 + f;
    f2._4_4_ = f2._4_4_ + 1;
  }
  return f + 1.0;
}

Assistant:

double KaizerWindow::bessel(const double x) {
	static const double EPS = 1.11E-16;

	double sum = 0.0;
	double f = 1.0;
	for (unsigned int i = 1;; ++i) {
		f *= (0.5 * x / i);
		double f2 = f * f;
		if (f2 <= sum * EPS) break;
		sum += f2;
	}
	return 1.0 + sum;
}